

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void pbrt::PlyErrorCallback(p_ply param_1,char *message)

{
  char **in_stack_00000018;
  char *in_stack_00000020;
  
  Error<char_const*&>(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

static void PlyErrorCallback(p_ply, const char *message) {
    Error("PLY writing error: %s", message);
}